

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput_x86_fma::forward
          (Yolov3DetectionOutput_x86_fma *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [16];
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __last;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __first;
  const_iterator __position;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  float *pfVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  float *outptr;
  float score;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float area;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  int q;
  float *end;
  float *ptr;
  float class_score;
  int class_index;
  int j;
  int i;
  int cs;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_5;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffff5a8;
  undefined7 in_stack_fffffffffffff5b0;
  undefined1 in_stack_fffffffffffff5b7;
  value_type *in_stack_fffffffffffff5b8;
  undefined7 in_stack_fffffffffffff5c0;
  undefined1 in_stack_fffffffffffff5c7;
  size_type in_stack_fffffffffffff5c8;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  *in_stack_fffffffffffff5d0;
  Mat *this_00;
  void **in_stack_fffffffffffff5e8;
  float fVar12;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffff5f0;
  float in_stack_fffffffffffff5f8;
  float in_stack_fffffffffffff5fc;
  float in_stack_fffffffffffff600;
  float in_stack_fffffffffffff604;
  float in_stack_fffffffffffff608;
  float in_stack_fffffffffffff60c;
  int local_8ac;
  size_type local_890;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_888;
  undefined1 local_870 [32];
  BBoxRect *local_850;
  BBoxRect *local_848;
  BBoxRect *local_840;
  reference local_830;
  int local_824;
  float local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  float local_80c;
  int local_808;
  float local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  float local_7f0;
  float local_7ec;
  float local_7e8;
  float local_7e4;
  float local_7e0;
  int local_7dc;
  float *local_7d8;
  float *local_7d0;
  float local_7c4;
  int local_7c0;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  void *local_7b0;
  int *local_7a8;
  ulong local_7a0;
  int local_798;
  Allocator *local_790;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  undefined4 local_778;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined4 local_750;
  Allocator *local_748;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined8 local_728;
  uint *local_720;
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined4 local_700;
  Allocator *local_6f8;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined8 local_6d8;
  uint *local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined4 local_6b0;
  Allocator *local_6a8;
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined8 local_688;
  uint *local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined4 local_660;
  Allocator *local_658;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined8 local_638;
  void *local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined4 local_610;
  Allocator *local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined8 local_5e8;
  void *local_5e0;
  float local_5d4;
  float local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  long local_5b8;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  const_reference local_598;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_580;
  ulong local_568;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_560;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_540;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_538;
  int local_524;
  long local_520;
  long *local_518;
  long local_510;
  long *local_508;
  long local_500;
  long *local_4f8;
  ulong local_4f0;
  long *local_4e8;
  ulong local_4e0;
  long *local_4d8;
  undefined1 local_4cd;
  int local_4cc;
  const_reference local_4c8;
  undefined8 *local_4c0;
  undefined1 local_4b5;
  int local_4b4;
  const_reference local_4b0;
  undefined8 *local_4a8;
  undefined1 local_49d;
  int local_49c;
  const_reference local_498;
  undefined8 *local_490;
  undefined1 local_485;
  int local_484;
  const_reference local_480;
  undefined8 *local_478;
  undefined1 local_46d;
  int local_46c;
  const_reference local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_408;
  undefined8 *local_3f8;
  undefined8 *local_3e8;
  undefined8 *local_3d8;
  undefined8 *local_3c8;
  void **local_3b8;
  undefined1 local_3a1;
  undefined4 local_3a0;
  int local_39c;
  const_reference local_398;
  void **local_390;
  reference local_380;
  int local_374;
  reference local_370;
  Allocator *local_368;
  int local_35c;
  size_t local_358;
  void *local_350;
  int local_344;
  int local_340;
  int local_33c;
  undefined8 *local_338;
  Allocator *local_330;
  int local_324;
  size_t local_320;
  void *local_318;
  int local_30c;
  int local_308;
  int local_304;
  undefined8 *local_300;
  Allocator *local_2f8;
  int local_2ec;
  size_t local_2e8;
  uint *local_2e0;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  Allocator *local_2c0;
  int local_2b4;
  size_t local_2b0;
  uint *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  undefined8 *local_290;
  Allocator *local_288;
  int local_27c;
  size_t local_278;
  uint *local_270;
  int local_264;
  int local_260;
  int local_25c;
  undefined8 *local_258;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  undefined4 local_20c;
  long local_208;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  undefined8 *local_1b8;
  undefined8 *local_198;
  undefined8 *local_178;
  undefined8 *local_158;
  undefined8 *local_138;
  Allocator *local_50;
  int local_44;
  ulong local_40;
  void *local_38;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  void **local_20;
  undefined4 local_14;
  long local_10;
  reference local_8;
  
  local_540 = in_RDX;
  local_538 = in_RSI;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x1a410f4);
  local_568 = 0;
  while( true ) {
    uVar2 = local_568;
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_538);
    fVar12 = (float)((ulong)in_stack_fffffffffffff5e8 >> 0x20);
    if (sVar3 <= uVar2) break;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)0x1a41146);
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    local_598 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_538,local_568);
    local_59c = local_598->w;
    local_5a0 = local_598->h;
    local_5a4 = local_598->c;
    local_5a8 = local_5a4 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if (local_5a8 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) + 5) {
      local_5b8 = local_568 * (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_4d8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170);
      local_4e0 = local_568;
      local_5bc = (int)(*(float *)(*local_4d8 + local_568 * 4) * (float)local_59c);
      local_4e8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170);
      local_4f0 = local_568;
      local_5c0 = (int)(*(float *)(*local_4e8 + local_568 * 4) * (float)local_5a0);
      for (local_5c4 = 0; local_5c4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_5c4 = local_5c4 + 1) {
        local_5c8 = local_5c4 * local_5a8;
        local_4f8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128);
        local_500 = local_5c4 + local_5b8;
        local_5cc = (int)*(float *)(*local_4f8 + local_500 * 4);
        local_508 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
        local_510 = (long)(local_5cc << 1);
        local_5d0 = *(float *)(*local_508 + local_510 * 4);
        local_518 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
        local_520 = (long)(local_5cc * 2 + 1);
        local_5d4 = *(float *)(*local_518 + local_520 * 4);
        local_460 = &local_628;
        local_33c = local_598->w;
        local_340 = local_598->h;
        local_344 = local_598->d;
        local_5e0 = (void *)((long)local_598->data +
                            local_598->cstep * (long)local_5c8 * local_598->elemsize);
        local_358 = local_598->elemsize;
        local_35c = local_598->elempack;
        local_368 = local_598->allocator;
        local_338 = &local_628;
        local_208 = (long)local_33c * (long)local_340 * local_358;
        local_438 = &local_628;
        local_408 = &local_628;
        local_484 = local_5c8 + 1;
        local_478 = &local_678;
        local_304 = local_598->w;
        local_308 = local_598->h;
        local_30c = local_598->d;
        local_630 = (void *)((long)local_598->data +
                            local_598->cstep * (long)local_484 * local_598->elemsize);
        local_320 = local_598->elemsize;
        local_324 = local_598->elempack;
        local_330 = local_598->allocator;
        local_300 = &local_678;
        local_218 = (long)local_304 * (long)local_308 * local_320;
        local_440 = &local_678;
        local_3f8 = &local_678;
        local_49c = local_5c8 + 2;
        local_490 = &local_6c8;
        local_2cc = local_598->w;
        local_2d0 = local_598->h;
        local_2d4 = local_598->d;
        local_680 = (uint *)((long)local_598->data +
                            local_598->cstep * (long)local_49c * local_598->elemsize);
        local_2e8 = local_598->elemsize;
        local_2ec = local_598->elempack;
        local_2f8 = local_598->allocator;
        local_2c8 = &local_6c8;
        local_228 = (long)local_2cc * (long)local_2d0 * local_2e8;
        local_448 = &local_6c8;
        local_3e8 = &local_6c8;
        local_4b4 = local_5c8 + 3;
        local_4a8 = &local_718;
        local_294 = local_598->w;
        local_298 = local_598->h;
        local_29c = local_598->d;
        local_6d0 = (uint *)((long)local_598->data +
                            local_598->cstep * (long)local_4b4 * local_598->elemsize);
        local_2b0 = local_598->elemsize;
        local_2b4 = local_598->elempack;
        local_2c0 = local_598->allocator;
        local_290 = &local_718;
        local_238 = (long)local_294 * (long)local_298 * local_2b0;
        local_450 = &local_718;
        local_3d8 = &local_718;
        local_4cc = local_5c8 + 4;
        local_4c0 = &local_768;
        local_25c = local_598->w;
        local_260 = local_598->h;
        local_264 = local_598->d;
        local_720 = (uint *)((long)local_598->data +
                            local_598->cstep * (long)local_4cc * local_598->elemsize);
        local_278 = local_598->elemsize;
        local_27c = local_598->elempack;
        local_288 = local_598->allocator;
        local_258 = &local_768;
        local_248 = (long)local_25c * (long)local_260 * local_278;
        local_458 = &local_768;
        local_3c8 = &local_768;
        local_5f0 = 0;
        local_5f4 = 0;
        local_5f8 = 0;
        local_5fc = 0;
        local_610 = 0;
        local_618 = 0;
        local_620 = 0;
        local_628 = 0;
        local_640 = 0;
        local_644 = 0;
        local_648 = 0;
        local_64c = 0;
        local_660 = 0;
        local_668 = 0;
        local_670 = 0;
        local_678 = 0;
        local_690 = 0;
        local_694 = 0;
        local_698 = 0;
        local_69c = 0;
        local_6b0 = 0;
        local_6b8 = 0;
        local_6c0 = 0;
        local_6c8 = 0;
        local_6e0 = 0;
        local_6e4 = 0;
        local_6e8 = 0;
        local_6ec = 0;
        local_700 = 0;
        local_708 = 0;
        local_710 = 0;
        local_718 = 0;
        local_20c = 0x10;
        local_21c = 0x10;
        local_22c = 0x10;
        local_23c = 0x10;
        local_24c = 0x10;
        local_468 = local_598;
        local_46d = 1;
        local_480 = local_598;
        local_485 = 1;
        local_498 = local_598;
        local_49d = 1;
        local_4b0 = local_598;
        local_4b5 = 1;
        local_4c8 = local_598;
        local_4cd = 1;
        local_5e8 = 0;
        local_600 = 0;
        local_638 = 0;
        local_650 = 0;
        local_688 = 0;
        local_6a0 = 0;
        local_6d8 = 0;
        local_6f0 = 0;
        local_768 = 0;
        local_758 = 0;
        local_750 = 0;
        local_73c = 0;
        local_738 = 0;
        local_734 = 0;
        local_730 = 0;
        local_760 = 0;
        local_39c = local_5c8 + 5;
        local_3a0 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_390 = &local_7b0;
        local_24 = local_598->w;
        local_28 = local_598->h;
        local_2c = local_598->d;
        local_7b0 = (void *)((long)local_598->data +
                            local_598->cstep * (long)local_39c * local_598->elemsize);
        local_40 = local_598->elemsize;
        local_44 = local_598->elempack;
        local_50 = local_598->allocator;
        local_20 = &local_7b0;
        local_7a8 = (int *)0x0;
        local_10 = (long)local_24 * (long)local_28 * (long)local_2c * local_40;
        local_788 = local_598->dims;
        local_14 = 0x10;
        local_398 = local_598;
        local_3a1 = 1;
        local_728 = 0;
        local_740 = 0;
        local_7b4 = (int)((local_10 + 0xfU & 0xfffffffffffffff0) / local_40);
        local_46c = local_5c8;
        local_350 = local_5e0;
        local_318 = local_630;
        local_2e0 = local_680;
        local_2a8 = local_6d0;
        local_270 = local_720;
        local_1b8 = local_3c8;
        local_198 = local_3d8;
        local_178 = local_3e8;
        local_158 = local_3f8;
        local_138 = local_408;
        local_38 = local_7b0;
        local_30 = local_3a0;
        local_7a0 = local_40;
        local_798 = local_44;
        local_790 = local_50;
        local_784 = local_24;
        local_780 = local_28;
        local_77c = local_2c;
        local_778 = local_3a0;
        local_748 = local_288;
        local_6f8 = local_2c0;
        local_6a8 = local_2f8;
        local_658 = local_330;
        local_608 = local_368;
        for (local_7b8 = 0; local_7b8 < local_5a0; local_7b8 = local_7b8 + 1) {
          for (local_7bc = 0; local_7bc < local_59c; local_7bc = local_7bc + 1) {
            local_7c0 = 0;
            local_7c4 = -3.4028235e+38;
            local_7d0 = (float *)((long)local_7b0 +
                                 (long)local_7bc * 4 + (long)(local_7b8 * local_59c) * 4);
            local_7d8 = local_7d0 +
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * local_7b4;
            local_7dc = 0;
            for (; local_7d0 < local_7d8; local_7d0 = local_7d0 + local_7b4) {
              if (local_7c4 < *local_7d0) {
                local_7c0 = local_7dc;
                local_7c4 = *local_7d0;
              }
              local_7dc = local_7dc + 1;
            }
            dVar9 = std::exp((double)((ulong)*local_720 ^ 0x8000000080000000));
            dVar10 = std::exp((double)((ulong)(uint)local_7c4 ^ 0x8000000080000000));
            local_7e0 = 1.0 / (SUB84(dVar9,0) * (SUB84(dVar10,0) + 1.0) + 1.0);
            if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= local_7e0) {
              in_stack_fffffffffffff608 = (float)local_7bc;
              in_stack_fffffffffffff60c = sigmoid(0.0);
              local_7e4 = (in_stack_fffffffffffff608 + in_stack_fffffffffffff60c) / (float)local_59c
              ;
              in_stack_fffffffffffff600 = (float)local_7b8;
              in_stack_fffffffffffff604 = sigmoid(0.0);
              local_7e8 = (in_stack_fffffffffffff600 + in_stack_fffffffffffff604) / (float)local_5a0
              ;
              dVar9 = std::exp((double)(ulong)*local_680);
              in_stack_fffffffffffff5fc = SUB84(dVar9,0);
              local_7ec = (in_stack_fffffffffffff5fc * local_5d0) / (float)local_5bc;
              dVar9 = std::exp((double)(ulong)*local_6d0);
              in_stack_fffffffffffff5f8 = SUB84(dVar9,0);
              local_7f0 = (in_stack_fffffffffffff5f8 * local_5d4) / (float)local_5c0;
              auVar11 = SUB6416(ZEXT464(0x3f000000),0);
              auVar1 = vfnmadd213ss_fma(auVar11,ZEXT416((uint)local_7ec),ZEXT416((uint)local_7e4));
              local_81c = auVar1._0_4_;
              auVar1 = vfnmadd213ss_fma(auVar11,ZEXT416((uint)local_7f0),ZEXT416((uint)local_7e8));
              local_818 = auVar1._0_4_;
              auVar1 = vfmadd213ss_fma(auVar11,ZEXT416((uint)local_7ec),ZEXT416((uint)local_7e4));
              local_814 = auVar1._0_4_;
              auVar1 = vfmadd213ss_fma(auVar11,ZEXT416((uint)local_7f0),ZEXT416((uint)local_7e8));
              local_810 = auVar1._0_4_;
              local_80c = local_7ec * local_7f0;
              local_820 = local_7e0;
              local_808 = local_7c0;
              local_804 = local_80c;
              local_800 = local_810;
              local_7fc = local_814;
              local_7f8 = local_818;
              local_7f4 = local_81c;
              std::
              vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ::operator[](&local_580,(long)local_5c4);
              std::
              vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                          in_stack_fffffffffffff5b8);
            }
            local_5e0 = (void *)((long)local_5e0 + 4);
            local_630 = (void *)((long)local_630 + 4);
            local_680 = local_680 + 1;
            local_6d0 = local_6d0 + 1;
            local_720 = local_720 + 1;
          }
        }
        in_stack_fffffffffffff5e8 = &local_7b0;
        local_3b8 = in_stack_fffffffffffff5e8;
        local_1d8 = in_stack_fffffffffffff5e8;
        if (local_7a8 != (int *)0x0) {
          local_1dc = 0xffffffff;
          LOCK();
          local_1e0 = *local_7a8;
          *local_7a8 = *local_7a8 + -1;
          UNLOCK();
          if (local_1e0 == 1) {
            if (local_790 == (Allocator *)0x0) {
              if (local_7b0 != (void *)0x0) {
                free(local_7b0);
              }
            }
            else {
              (*local_790->_vptr_Allocator[3])(local_790,local_7b0);
            }
          }
        }
        *in_stack_fffffffffffff5e8 = (void *)0x0;
        in_stack_fffffffffffff5e8[2] = (void *)0x0;
        *(undefined4 *)(in_stack_fffffffffffff5e8 + 3) = 0;
        *(undefined4 *)(in_stack_fffffffffffff5e8 + 5) = 0;
        *(undefined4 *)((long)in_stack_fffffffffffff5e8 + 0x2c) = 0;
        *(undefined4 *)(in_stack_fffffffffffff5e8 + 6) = 0;
        *(undefined4 *)((long)in_stack_fffffffffffff5e8 + 0x34) = 0;
        *(undefined4 *)(in_stack_fffffffffffff5e8 + 7) = 0;
        in_stack_fffffffffffff5e8[8] = (void *)0x0;
        in_stack_fffffffffffff5e8[1] = (void *)0x0;
      }
      for (local_824 = 0; local_824 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_824 = local_824 + 1) {
        local_830 = std::
                    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ::operator[](&local_580,(long)local_824);
        local_840 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff5a8);
        __gnu_cxx::
        __normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>
        ::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect*>
                  ((__normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0),
                   (__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffff5a8);
        local_848 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::begin(in_stack_fffffffffffff5a8);
        local_850 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff5a8);
        __position._M_current._4_4_ = in_stack_fffffffffffff60c;
        __position._M_current._0_4_ = in_stack_fffffffffffff608;
        __first._M_current._4_4_ = in_stack_fffffffffffff604;
        __first._M_current._0_4_ = in_stack_fffffffffffff600;
        __last._M_current._4_4_ = in_stack_fffffffffffff5fc;
        __last._M_current._0_4_ = in_stack_fffffffffffff5f8;
        local_870._24_8_ =
             std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
             ::
             insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                       (in_stack_fffffffffffff5f0,__position,__first,__last);
      }
      local_5ac = 0;
    }
    else {
      local_524 = -1;
      local_5ac = 1;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    if (local_5ac != 0) goto LAB_01a43a2a;
    local_568 = local_568 + 1;
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)in_stack_fffffffffffff5b8);
  this_00 = (Mat *)local_870;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a43665);
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600),
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff5f0,
             fVar12);
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x1a436a4);
  local_890 = 0;
  while (sVar3 = local_890,
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_870),
        sVar3 < sVar4) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_870,local_890
                       );
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::operator[](&local_560,*pvVar5);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                in_stack_fffffffffffff5b8);
    local_890 = local_890 + 1;
  }
  sVar4 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size(&local_888);
  if ((int)sVar4 == 0) {
    local_524 = 0;
  }
  else {
    pvVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_540,0);
    Mat::create(this_00,(int)(sVar3 >> 0x20),(int)sVar3,
                CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                (Allocator *)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5c7 = true;
    if (pvVar6->data != (void *)0x0) {
      in_stack_fffffffffffff5c7 = pvVar6->cstep * (long)pvVar6->c == 0;
      local_8 = pvVar6;
    }
    local_380 = pvVar6;
    if ((bool)in_stack_fffffffffffff5c7 == false) {
      for (local_8ac = 0; local_8ac < (int)sVar4; local_8ac = local_8ac + 1) {
        pvVar7 = std::
                 vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ::operator[](&local_888,(long)local_8ac);
        fVar12 = pvVar7->score;
        local_374 = local_8ac;
        pfVar8 = (float *)((long)pvVar6->data + (long)pvVar6->w * (long)local_8ac * pvVar6->elemsize
                          );
        *pfVar8 = (float)(pvVar7->label + 1);
        pfVar8[1] = fVar12;
        pfVar8[2] = pvVar7->xmin;
        pfVar8[3] = pvVar7->ymin;
        pfVar8[4] = pvVar7->xmax;
        pfVar8[5] = pvVar7->ymax;
        local_370 = pvVar6;
      }
      local_524 = 0;
    }
    else {
      local_524 = -100;
    }
  }
  local_5ac = 1;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
LAB_01a43a2a:
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
  return local_524;
}

Assistant:

int Yolov3DetectionOutput_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}